

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tmbstr.c
# Opt level: O2

uint prvTidytmbstrcat(tmbstr s1,ctmbstr s2)

{
  char cVar1;
  long lVar2;
  char *pcVar3;
  
  do {
    pcVar3 = s1;
    s1 = pcVar3 + 1;
  } while (*pcVar3 != '\0');
  for (lVar2 = 0; cVar1 = s2[lVar2], pcVar3[lVar2] = cVar1, cVar1 != '\0'; lVar2 = lVar2 + 1) {
  }
  return (uint)lVar2;
}

Assistant:

uint TY_(tmbstrcat)( tmbstr s1, ctmbstr s2 )
{
    uint ncpy = 0;
    while ( *s1 )
        ++s1;

    while (0 != (*s1++ = *s2++) )
        ++ncpy;
    return ncpy;
}